

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrj_.c
# Opt level: O0

void hybrj_(minpack_funcder_nn fcnder_nn,int *n,double *x,double *fvec,double *fjac,int *ldfjac,
           double *xtol,int *maxfev,double *diag,int *mode,double *factor,int *nprint,int *info,
           int *nfev,int *njev,double *r__,int *lr,double *qtf,double *wa1,double *wa2,double *wa3,
           double *wa4)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long in_RCX;
  long in_RDX;
  int *in_RSI;
  code *in_RDI;
  long in_R8;
  int *in_R9;
  double *v;
  int *lda;
  double *pdVar9;
  double *in_stack_00000008;
  int *in_stack_00000010;
  long in_stack_00000018;
  int *in_stack_00000020;
  double *in_stack_00000028;
  int *in_stack_00000030;
  int *in_stack_00000038;
  int *in_stack_00000040;
  int *in_stack_00000048;
  double prered;
  double epsmch;
  double actred;
  double *in_stack_00000068;
  int ncfail;
  int nslow2;
  int nslow1;
  double fnorm1;
  double xnorm;
  double pnorm;
  double fnorm;
  double ratio;
  int ncsuc;
  int jeval;
  double delta;
  int iflag;
  double temp;
  int iter;
  int sing;
  double sum;
  int iwa [1];
  int jm1;
  int l;
  int j;
  int i__;
  double d__2;
  double d__1;
  int i__2;
  int i__1;
  int fjac_offset;
  int fjac_dim1;
  int c__1;
  int c_false;
  int *piVar10;
  double *pdVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double *local_120;
  double *local_108;
  double *w;
  int *lda_00;
  undefined4 in_stack_ffffffffffffff20;
  int iVar15;
  undefined4 in_stack_ffffffffffffff28;
  int iVar16;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar17;
  int *in_stack_ffffffffffffff30;
  int *ipvt;
  double *in_stack_ffffffffffffff40;
  double *in_stack_ffffffffffffff50;
  int iVar18;
  int iVar19;
  double *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  int iVar20;
  double *in_stack_ffffffffffffff70;
  int iVar21;
  undefined4 in_stack_ffffffffffffff7c;
  double *in_stack_ffffffffffffff80;
  double *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  int iVar22;
  int iVar23;
  int iVar24;
  double *in_stack_ffffffffffffffa0;
  int local_40 [2];
  int *local_38;
  long local_30;
  long local_28;
  long local_20;
  int *local_18;
  code *local_10;
  
  local_40[1] = 0;
  local_40[0] = 1;
  ipvt = (int *)0x0;
  lVar4 = (long)fnorm1 + -8;
  lVar5 = (long)_nslow2 + -8;
  lVar6 = (long)actred + -8;
  lVar7 = in_stack_00000018 + -8;
  local_28 = in_RCX + -8;
  local_20 = in_RDX + -8;
  iVar1 = *in_R9;
  iVar3 = iVar1 + 1;
  local_30 = in_R8 + (long)iVar3 * -8;
  lVar8 = (long)prered + -8;
  local_38 = in_R9;
  local_18 = in_RSI;
  local_10 = in_RDI;
  v = (double *)dpmpar_(local_40);
  *in_stack_00000038 = 0;
  iVar20 = 0;
  *in_stack_00000040 = 0;
  *in_stack_00000048 = 0;
  if ((((0 < *local_18) && (*local_18 <= *local_38)) &&
      (0.0 < *in_stack_00000008 || *in_stack_00000008 == 0.0)) &&
     (((0 < *in_stack_00000010 && (0.0 < *in_stack_00000028)) &&
      ((*local_18 * (*local_18 + 1)) / 2 <= *(int *)epsmch)))) {
    if (*in_stack_00000020 == 2) {
      for (iVar15 = 1; iVar15 <= *local_18; iVar15 = iVar15 + 1) {
        if (*(double *)(lVar7 + (long)iVar15 * 8) <= 0.0) goto LAB_00103685;
      }
    }
    iVar20 = 1;
    (*local_10)(local_18,local_20 + 8,local_28 + 8,local_30 + (long)iVar3 * 8,local_38,
                &stack0xffffffffffffff6c);
    *in_stack_00000040 = 1;
    if (-1 < iVar20) {
      lda = (int *)enorm_(in_stack_ffffffffffffff30,
                          (double *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      iVar21 = 1;
      iVar18 = 0;
      iVar15 = 0;
      iVar17 = 0;
      iVar16 = 0;
      while( true ) {
        iVar19 = 1;
        iVar20 = 2;
        (*local_10)(local_18,local_20 + 8,local_28 + 8,local_30 + (long)iVar3 * 8,local_38,
                    &stack0xffffffffffffff6c);
        *in_stack_00000048 = *in_stack_00000048 + 1;
        if (iVar20 < 0) break;
        piVar10 = local_40;
        pdVar11 = in_stack_00000068;
        dVar13 = _nslow2;
        dVar14 = fnorm1;
        qrfac_((int *)in_stack_ffffffffffffff60,(int *)CONCAT44(iVar19,iVar18),
               in_stack_ffffffffffffff50,lda,(int *)in_stack_ffffffffffffff40,ipvt,
               (int *)in_stack_ffffffffffffff70,(double *)CONCAT44(in_stack_ffffffffffffff7c,iVar21)
               ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff88);
        if (iVar21 == 1) {
          if (*in_stack_00000020 != 2) {
            iVar23 = *local_18;
            for (iVar24 = 1; iVar24 <= iVar23; iVar24 = iVar24 + 1) {
              *(undefined8 *)(lVar7 + (long)iVar24 * 8) = *(undefined8 *)(lVar5 + (long)iVar24 * 8);
              dVar12 = *(double *)(lVar5 + (long)iVar24 * 8);
              if ((dVar12 == 0.0) && (!NAN(dVar12))) {
                *(undefined8 *)(lVar7 + (long)iVar24 * 8) = 0x3ff0000000000000;
              }
            }
          }
          iVar23 = *local_18;
          for (iVar24 = 1; iVar24 <= iVar23; iVar24 = iVar24 + 1) {
            *(double *)(lVar4 + (long)iVar24 * 8) =
                 *(double *)(lVar7 + (long)iVar24 * 8) * *(double *)(local_20 + (long)iVar24 * 8);
          }
          ipvt = (int *)enorm_(in_stack_ffffffffffffff30,(double *)CONCAT44(iVar17,iVar16));
          in_stack_ffffffffffffff60 = (double *)(*in_stack_00000028 * (double)ipvt);
          if (((double)in_stack_ffffffffffffff60 == 0.0) &&
             (!NAN((double)in_stack_ffffffffffffff60))) {
            in_stack_ffffffffffffff60 = (double *)*in_stack_00000028;
          }
        }
        iVar23 = *local_18;
        for (iVar24 = 1; iVar24 <= iVar23; iVar24 = iVar24 + 1) {
          *(undefined8 *)(lVar6 + (long)iVar24 * 8) = *(undefined8 *)(local_28 + (long)iVar24 * 8);
        }
        iVar23 = *local_18;
        for (iVar22 = 1; iVar22 <= iVar23; iVar22 = iVar22 + 1) {
          dVar12 = *(double *)(local_30 + (long)(iVar22 + iVar22 * iVar1) * 8);
          if ((dVar12 != 0.0) || (NAN(dVar12))) {
            in_stack_ffffffffffffff80 = (double *)0x0;
            for (iVar24 = iVar22; iVar24 <= *local_18; iVar24 = iVar24 + 1) {
              in_stack_ffffffffffffff80 =
                   (double *)
                   (*(double *)(local_30 + (long)(iVar24 + iVar22 * iVar1) * 8) *
                    *(double *)(lVar6 + (long)iVar24 * 8) + (double)in_stack_ffffffffffffff80);
            }
            in_stack_ffffffffffffff70 =
                 (double *)
                 (-(double)in_stack_ffffffffffffff80 /
                 *(double *)(local_30 + (long)(iVar22 + iVar22 * iVar1) * 8));
            iVar2 = *local_18;
            for (iVar24 = iVar22; iVar24 <= iVar2; iVar24 = iVar24 + 1) {
              *(double *)(lVar6 + (long)iVar24 * 8) =
                   *(double *)(local_30 + (long)(iVar24 + iVar22 * iVar1) * 8) *
                   (double)in_stack_ffffffffffffff70 + *(double *)(lVar6 + (long)iVar24 * 8);
            }
          }
        }
        in_stack_ffffffffffffff7c = 0;
        iVar23 = *local_18;
        for (iVar22 = 1; iVar22 <= iVar23; iVar22 = iVar22 + 1) {
          in_stack_ffffffffffffff90 = iVar22 + -1;
          in_stack_ffffffffffffff94 = iVar22;
          if (0 < in_stack_ffffffffffffff90) {
            for (iVar24 = 1; iVar24 <= in_stack_ffffffffffffff90; iVar24 = iVar24 + 1) {
              *(undefined8 *)(lVar8 + (long)in_stack_ffffffffffffff94 * 8) =
                   *(undefined8 *)(local_30 + (long)(iVar24 + iVar22 * iVar1) * 8);
              in_stack_ffffffffffffff94 = (in_stack_ffffffffffffff94 + *local_18) - iVar24;
            }
          }
          *(double *)(lVar8 + (long)in_stack_ffffffffffffff94 * 8) =
               in_stack_00000068[(long)iVar22 + -1];
          if ((in_stack_00000068[(long)iVar22 + -1] == 0.0) &&
             (!NAN(in_stack_00000068[(long)iVar22 + -1]))) {
            in_stack_ffffffffffffff7c = 1;
          }
        }
        qform_(local_18,local_18,(double *)(local_30 + (long)iVar3 * 8),local_38,in_stack_00000068);
        if (*in_stack_00000020 != 2) {
          iVar23 = *local_18;
          for (iVar22 = 1; iVar22 <= iVar23; iVar22 = iVar22 + 1) {
            pdVar9 = *(double **)(lVar7 + (long)iVar22 * 8);
            in_stack_ffffffffffffffa0 = *(double **)(lVar5 + (long)iVar22 * 8);
            local_108 = in_stack_ffffffffffffffa0;
            if ((double)in_stack_ffffffffffffffa0 <= (double)pdVar9) {
              local_108 = pdVar9;
            }
            *(double **)(lVar7 + (long)iVar22 * 8) = local_108;
          }
        }
        while( true ) {
          if (0 < *in_stack_00000030) {
            iVar20 = 0;
            if ((iVar21 + -1) % *in_stack_00000030 == 0) {
              (*local_10)(local_18,local_20 + 8,local_28 + 8,local_30 + (long)iVar3 * 8,local_38,
                          &stack0xffffffffffffff6c,piVar10,pdVar11,dVar13,dVar14);
            }
            if (iVar20 < 0) goto LAB_00103685;
          }
          pdVar11 = in_stack_00000068;
          dVar12 = _nslow2;
          dVar13 = fnorm1;
          dogleg_((int *)in_stack_ffffffffffffff80,
                  (double *)CONCAT44(in_stack_ffffffffffffff7c,iVar21),
                  (int *)in_stack_ffffffffffffff70,
                  (double *)CONCAT44(iVar20,in_stack_ffffffffffffff68),in_stack_ffffffffffffff60,
                  (double *)CONCAT44(iVar19,iVar18),
                  (double *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (double *)CONCAT44(iVar24,iVar22),in_stack_ffffffffffffffa0);
          iVar20 = *local_18;
          for (iVar23 = 1; iVar23 <= iVar20; iVar23 = iVar23 + 1) {
            in_stack_00000068[(long)iVar23 + -1] = -in_stack_00000068[(long)iVar23 + -1];
            *(double *)(lVar5 + (long)iVar23 * 8) =
                 *(double *)(local_20 + (long)iVar23 * 8) + in_stack_00000068[(long)iVar23 + -1];
            *(double *)(lVar4 + (long)iVar23 * 8) =
                 *(double *)(lVar7 + (long)iVar23 * 8) * in_stack_00000068[(long)iVar23 + -1];
          }
          in_stack_ffffffffffffff40 =
               (double *)enorm_(in_stack_ffffffffffffff30,(double *)CONCAT44(iVar17,iVar16));
          pdVar9 = in_stack_ffffffffffffff60;
          if ((iVar21 == 1) &&
             (pdVar9 = in_stack_ffffffffffffff40,
             (double)in_stack_ffffffffffffff60 <= (double)in_stack_ffffffffffffff40)) {
            pdVar9 = in_stack_ffffffffffffff60;
          }
          iVar20 = 1;
          (*local_10)(local_18,_nslow2,xnorm,local_30 + (long)iVar3 * 8,local_38,
                      &stack0xffffffffffffff6c,pdVar11,dVar12);
          *in_stack_00000040 = *in_stack_00000040 + 1;
          if (iVar20 < 0) goto LAB_00103685;
          in_stack_ffffffffffffff30 =
               (int *)enorm_(in_stack_ffffffffffffff30,(double *)CONCAT44(iVar17,iVar16));
          lda_00 = (int *)0xbff0000000000000;
          if ((double)in_stack_ffffffffffffff30 < (double)lda) {
            lda_00 = (int *)(-((double)in_stack_ffffffffffffff30 / (double)lda) *
                             ((double)in_stack_ffffffffffffff30 / (double)lda) + 1.0);
          }
          in_stack_ffffffffffffff94 = 1;
          iVar23 = *local_18;
          for (iVar24 = 1; iVar24 <= iVar23; iVar24 = iVar24 + 1) {
            in_stack_ffffffffffffff80 = (double *)0x0;
            for (iVar22 = iVar24; iVar22 <= *local_18; iVar22 = iVar22 + 1) {
              in_stack_ffffffffffffff80 =
                   (double *)
                   (*(double *)(lVar8 + (long)in_stack_ffffffffffffff94 * 8) *
                    in_stack_00000068[(long)iVar22 + -1] + (double)in_stack_ffffffffffffff80);
              in_stack_ffffffffffffff94 = in_stack_ffffffffffffff94 + 1;
            }
            *(double *)(lVar4 + (long)iVar24 * 8) =
                 *(double *)(lVar6 + (long)iVar24 * 8) + (double)in_stack_ffffffffffffff80;
          }
          in_stack_ffffffffffffff70 =
               (double *)enorm_(in_stack_ffffffffffffff30,(double *)CONCAT44(iVar17,iVar16));
          w = (double *)0x0;
          if ((double)in_stack_ffffffffffffff70 < (double)lda) {
            w = (double *)
                (-((double)in_stack_ffffffffffffff70 / (double)lda) *
                 ((double)in_stack_ffffffffffffff70 / (double)lda) + 1.0);
          }
          in_stack_ffffffffffffff50 = (double *)0x0;
          if (0.0 < (double)w) {
            in_stack_ffffffffffffff50 = (double *)((double)lda_00 / (double)w);
          }
          if ((double)in_stack_ffffffffffffff50 < 0.1) {
            iVar18 = 0;
            iVar15 = iVar15 + 1;
            in_stack_ffffffffffffff60 = (double *)((double)pdVar9 * 0.5);
          }
          else {
            iVar15 = 0;
            iVar18 = iVar18 + 1;
            if (((0.5 <= (double)in_stack_ffffffffffffff50) ||
                (in_stack_ffffffffffffff60 = pdVar9, 1 < iVar18)) &&
               (in_stack_ffffffffffffffa0 = (double *)((double)in_stack_ffffffffffffff40 / 0.5),
               in_stack_ffffffffffffff60 = in_stack_ffffffffffffffa0,
               (double)in_stack_ffffffffffffffa0 <= (double)pdVar9)) {
              in_stack_ffffffffffffff60 = pdVar9;
            }
            if (ABS((double)in_stack_ffffffffffffff50 - 1.0) <= 0.1) {
              in_stack_ffffffffffffff60 = (double *)((double)in_stack_ffffffffffffff40 / 0.5);
            }
          }
          if (0.0001 <= (double)in_stack_ffffffffffffff50) {
            iVar23 = *local_18;
            for (iVar22 = 1; iVar22 <= iVar23; iVar22 = iVar22 + 1) {
              *(undefined8 *)(local_20 + (long)iVar22 * 8) =
                   *(undefined8 *)(lVar5 + (long)iVar22 * 8);
              *(double *)(lVar5 + (long)iVar22 * 8) =
                   *(double *)(lVar7 + (long)iVar22 * 8) * *(double *)(local_20 + (long)iVar22 * 8);
              *(undefined8 *)(local_28 + (long)iVar22 * 8) =
                   *(undefined8 *)((long)xnorm + -8 + (long)iVar22 * 8);
            }
            ipvt = (int *)enorm_(in_stack_ffffffffffffff30,(double *)CONCAT44(iVar17,iVar16));
            iVar21 = iVar21 + 1;
            lda = in_stack_ffffffffffffff30;
          }
          iVar17 = iVar17 + 1;
          if (0.001 <= (double)lda_00) {
            iVar17 = 0;
          }
          if (iVar19 != 0) {
            iVar16 = iVar16 + 1;
          }
          if (0.1 <= (double)lda_00) {
            iVar16 = 0;
          }
          if (((double)in_stack_ffffffffffffff60 <= *in_stack_00000008 * (double)ipvt) ||
             (((double)lda == 0.0 && (!NAN((double)lda))))) {
            *in_stack_00000038 = 1;
          }
          if (*in_stack_00000038 != 0) goto LAB_00103685;
          if (*in_stack_00000010 <= *in_stack_00000040) {
            *in_stack_00000038 = 2;
          }
          pdVar9 = (double *)((double)in_stack_ffffffffffffff60 * 0.1);
          local_120 = in_stack_ffffffffffffff40;
          if ((double)in_stack_ffffffffffffff40 <= (double)pdVar9) {
            local_120 = pdVar9;
          }
          if ((double)local_120 * 0.1 <= (double)v * (double)ipvt) {
            *in_stack_00000038 = 3;
          }
          if (iVar16 == 5) {
            *in_stack_00000038 = 4;
          }
          if (iVar17 == 10) {
            *in_stack_00000038 = 5;
          }
          if (*in_stack_00000038 != 0) goto LAB_00103685;
          if (iVar15 == 2) break;
          iVar19 = *local_18;
          for (iVar22 = 1; iVar22 <= iVar19; iVar22 = iVar22 + 1) {
            in_stack_ffffffffffffff80 = (double *)0x0;
            for (iVar24 = 1; iVar24 <= *local_18; iVar24 = iVar24 + 1) {
              in_stack_ffffffffffffff80 =
                   (double *)
                   (*(double *)(local_30 + (long)(iVar24 + iVar22 * iVar1) * 8) *
                    *(double *)((long)xnorm + -8 + (long)iVar24 * 8) +
                   (double)in_stack_ffffffffffffff80);
            }
            *(double *)(lVar5 + (long)iVar22 * 8) =
                 ((double)in_stack_ffffffffffffff80 - *(double *)(lVar4 + (long)iVar22 * 8)) /
                 (double)in_stack_ffffffffffffff40;
            in_stack_00000068[(long)iVar22 + -1] =
                 *(double *)(lVar7 + (long)iVar22 * 8) *
                 ((*(double *)(lVar7 + (long)iVar22 * 8) * in_stack_00000068[(long)iVar22 + -1]) /
                 (double)in_stack_ffffffffffffff40);
            if (0.0001 <= (double)in_stack_ffffffffffffff50) {
              *(double **)(lVar6 + (long)iVar22 * 8) = in_stack_ffffffffffffff80;
            }
          }
          pdVar11 = (double *)&stack0xffffffffffffff7c;
          piVar10 = (int *)fnorm1;
          r1updt_((int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                  (int *)in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                  (int *)CONCAT44(in_stack_ffffffffffffff7c,iVar21),in_stack_ffffffffffffff70,
                  (double *)CONCAT44(iVar20,in_stack_ffffffffffffff68),in_stack_ffffffffffffffa0,
                  (int *)pdVar9);
          r1mpyq_(in_stack_ffffffffffffff30,(int *)CONCAT44(iVar17,iVar16),
                  (double *)CONCAT44(iVar15,in_stack_ffffffffffffff20),lda_00,v,w);
          r1mpyq_(in_stack_ffffffffffffff30,(int *)CONCAT44(iVar17,iVar16),
                  (double *)CONCAT44(iVar15,in_stack_ffffffffffffff20),lda_00,v,w);
          iVar19 = 0;
        }
      }
    }
  }
LAB_00103685:
  if (iVar20 < 0) {
    *in_stack_00000038 = iVar20;
  }
  if (0 < *in_stack_00000030) {
    (*local_10)(local_18,local_20 + 8,local_28 + 8,local_30 + (long)iVar3 * 8,local_38,
                &stack0xffffffffffffff6c);
  }
  return;
}

Assistant:

__minpack_attr__
void __minpack_func__(hybrj)(__minpack_decl_fcnder_nn__  const int *n, real *x, real *
	fvec, real *fjac, const int *ldfjac, const real *xtol, const int *
	maxfev, real *diag, const int *mode, const real *factor, const int *
	nprint, int *info, int *nfev, int *njev, real *r__, 
	const int *lr, real *qtf, real *wa1, real *wa2, 
	real *wa3, real *wa4)
{
    /* Initialized data */

#define p1 ((real).1)
#define p5 ((real).5)
#define p001 .001
#define p0001 1e-4
    const int c_false = FALSE_;
    const int c__1 = 1;

    /* System generated locals */
    int fjac_dim1, fjac_offset, i__1, i__2;
    real d__1, d__2;

    /* Local variables */
    int i__, j, l, jm1, iwa[1];
    real sum;
    int sing;
    int iter;
    real temp;
    int iflag;
    real delta;
    int jeval;
    int ncsuc;
    real ratio;
    real fnorm;
    real pnorm, xnorm = 0, fnorm1;
    int nslow1, nslow2;
    int ncfail;
    real actred, epsmch, prered;

/*     ********** */

/*     subroutine hybrj */

/*     the purpose of hybrj is to find a zero of a system of */
/*     n nonlinear functions in n variables by a modification */
/*     of the powell hybrid method. the user must provide a */
/*     subroutine which calculates the functions and the jacobian. */

/*     the subroutine statement is */

/*       subroutine hybrj(fcn,n,x,fvec,fjac,ldfjac,xtol,maxfev,diag, */
/*                        mode,factor,nprint,info,nfev,njev,r,lr,qtf, */
/*                        wa1,wa2,wa3,wa4) */

/*     where */

/*       fcn is the name of the user-supplied subroutine which */
/*         calculates the functions and the jacobian. fcn must */
/*         be declared in an external statement in the user */
/*         calling program, and should be written as follows. */

/*         subroutine fcn(n,x,fvec,fjac,ldfjac,iflag) */
/*         integer n,ldfjac,iflag */
/*         double precision x(n),fvec(n),fjac(ldfjac,n) */
/*         ---------- */
/*         if iflag = 1 calculate the functions at x and */
/*         return this vector in fvec. do not alter fjac. */
/*         if iflag = 2 calculate the jacobian at x and */
/*         return this matrix in fjac. do not alter fvec. */
/*         --------- */
/*         return */
/*         end */

/*         the value of iflag should not be changed by fcn unless */
/*         the user wants to terminate execution of hybrj. */
/*         in this case set iflag to a negative integer. */

/*       n is a positive integer input variable set to the number */
/*         of functions and variables. */

/*       x is an array of length n. on input x must contain */
/*         an initial estimate of the solution vector. on output x */
/*         contains the final estimate of the solution vector. */

/*       fvec is an output array of length n which contains */
/*         the functions evaluated at the output x. */

/*       fjac is an output n by n array which contains the */
/*         orthogonal matrix q produced by the qr factorization */
/*         of the final approximate jacobian. */

/*       ldfjac is a positive integer input variable not less than n */
/*         which specifies the leading dimension of the array fjac. */

/*       xtol is a nonnegative input variable. termination */
/*         occurs when the relative error between two consecutive */
/*         iterates is at most xtol. */

/*       maxfev is a positive integer input variable. termination */
/*         occurs when the number of calls to fcn with iflag = 1 */
/*         has reached maxfev. */

/*       diag is an array of length n. if mode = 1 (see */
/*         below), diag is internally set. if mode = 2, diag */
/*         must contain positive entries that serve as */
/*         multiplicative scale factors for the variables. */

/*       mode is an integer input variable. if mode = 1, the */
/*         variables will be scaled internally. if mode = 2, */
/*         the scaling is specified by the input diag. other */
/*         values of mode are equivalent to mode = 1. */

/*       factor is a positive input variable used in determining the */
/*         initial step bound. this bound is set to the product of */
/*         factor and the euclidean norm of diag*x if nonzero, or else */
/*         to factor itself. in most cases factor should lie in the */
/*         interval (.1,100.). 100. is a generally recommended value. */

/*       nprint is an integer input variable that enables controlled */
/*         printing of iterates if it is positive. in this case, */
/*         fcn is called with iflag = 0 at the beginning of the first */
/*         iteration and every nprint iterations thereafter and */
/*         immediately prior to return, with x and fvec available */
/*         for printing. fvec and fjac should not be altered. */
/*         if nprint is not positive, no special calls of fcn */
/*         with iflag = 0 are made. */

/*       info is an integer output variable. if the user has */
/*         terminated execution, info is set to the (negative) */
/*         value of iflag. see description of fcn. otherwise, */
/*         info is set as follows. */

/*         info = 0   improper input parameters. */

/*         info = 1   relative error between two consecutive iterates */
/*                    is at most xtol. */

/*         info = 2   number of calls to fcn with iflag = 1 has */
/*                    reached maxfev. */

/*         info = 3   xtol is too small. no further improvement in */
/*                    the approximate solution x is possible. */

/*         info = 4   iteration is not making good progress, as */
/*                    measured by the improvement from the last */
/*                    five jacobian evaluations. */

/*         info = 5   iteration is not making good progress, as */
/*                    measured by the improvement from the last */
/*                    ten iterations. */

/*       nfev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 1. */

/*       njev is an integer output variable set to the number of */
/*         calls to fcn with iflag = 2. */

/*       r is an output array of length lr which contains the */
/*         upper triangular matrix produced by the qr factorization */
/*         of the final approximate jacobian, stored rowwise. */

/*       lr is a positive integer input variable not less than */
/*         (n*(n+1))/2. */

/*       qtf is an output array of length n which contains */
/*         the vector (q transpose)*fvec. */

/*       wa1, wa2, wa3, and wa4 are work arrays of length n. */

/*     subprograms called */

/*       user-supplied ...... fcn */

/*       minpack-supplied ... dogleg,dpmpar,enorm, */
/*                            qform,qrfac,r1mpyq,r1updt */

/*       fortran-supplied ... dabs,dmax1,dmin1,mod */

/*     argonne national laboratory. minpack project. march 1980. */
/*     burton s. garbow, kenneth e. hillstrom, jorge j. more */

/*     ********** */
    /* Parameter adjustments */
    --wa4;
    --wa3;
    --wa2;
    --wa1;
    --qtf;
    --diag;
    --fvec;
    --x;
    fjac_dim1 = *ldfjac;
    fjac_offset = 1 + fjac_dim1 * 1;
    fjac -= fjac_offset;
    --r__;

    /* Function Body */

/*     epsmch is the machine precision. */

    epsmch = __minpack_func__(dpmpar)(&c__1);

    *info = 0;
    iflag = 0;
    *nfev = 0;
    *njev = 0;

/*     check the input parameters for errors. */

    if (*n <= 0 || *ldfjac < *n || *xtol < 0. || *maxfev <= 0 || *factor <= 
	    0. || *lr < *n * (*n + 1) / 2) {
	goto L300;
    }
    if (*mode != 2) {
	goto L20;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (diag[j] <= 0.) {
	    goto L300;
	}
/* L10: */
    }
L20:

/*     evaluate the function at the starting point */
/*     and calculate its norm. */

    iflag = 1;
    fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    *nfev = 1;
    if (iflag < 0) {
	goto L300;
    }
    fnorm = __minpack_func__(enorm)(n, &fvec[1]);

/*     initialize iteration counter and monitors. */

    iter = 1;
    ncsuc = 0;
    ncfail = 0;
    nslow1 = 0;
    nslow2 = 0;

/*     beginning of the outer loop. */

L30:
    jeval = TRUE_;

/*        calculate the jacobian matrix. */

    iflag = 2;
    fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*njev);
    if (iflag < 0) {
	goto L300;
    }

/*        compute the qr factorization of the jacobian. */

    __minpack_func__(qrfac)(n, n, &fjac[fjac_offset], ldfjac, &c_false, iwa, &c__1, &wa1[1], &
	    wa2[1], &wa3[1]);

/*        on the first iteration and if mode is 1, scale according */
/*        to the norms of the columns of the initial jacobian. */

    if (iter != 1) {
	goto L70;
    }
    if (*mode == 2) {
	goto L50;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	diag[j] = wa2[j];
	if (wa2[j] == 0.) {
	    diag[j] = 1.;
	}
/* L40: */
    }
L50:

/*        on the first iteration, calculate the norm of the scaled x */
/*        and initialize the step bound delta. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa3[j] = diag[j] * x[j];
/* L60: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa3[1]);
    delta = *factor * xnorm;
    if (delta == 0.) {
	delta = *factor;
    }
L70:

/*        form (q transpose)*fvec and store in qtf. */

    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	qtf[i__] = fvec[i__];
/* L80: */
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	if (fjac[j + j * fjac_dim1] == 0.) {
	    goto L110;
	}
	sum = 0.;
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * qtf[i__];
/* L90: */
	}
	temp = -sum / fjac[j + j * fjac_dim1];
	i__2 = *n;
	for (i__ = j; i__ <= i__2; ++i__) {
	    qtf[i__] += fjac[i__ + j * fjac_dim1] * temp;
/* L100: */
	}
L110:
/* L120: */
	;
    }

/*        copy the triangular factor of the qr factorization into r. */

    sing = FALSE_;
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	l = j;
	jm1 = j - 1;
	if (jm1 < 1) {
	    goto L140;
	}
	i__2 = jm1;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    r__[l] = fjac[i__ + j * fjac_dim1];
	    l = l + *n - i__;
/* L130: */
	}
L140:
	r__[l] = wa1[j];
	if (wa1[j] == 0.) {
	    sing = TRUE_;
	}
/* L150: */
    }

/*        accumulate the orthogonal factor in fjac. */

    __minpack_func__(qform)(n, n, &fjac[fjac_offset], ldfjac, &wa1[1]);

/*        rescale if necessary. */

    if (*mode == 2) {
	goto L170;
    }
    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
/* Computing MAX */
	d__1 = diag[j], d__2 = wa2[j];
	diag[j] = max(d__1,d__2);
/* L160: */
    }
L170:

/*        beginning of the inner loop. */

L180:

/*           if requested, call fcn to enable printing of iterates. */

    if (*nprint <= 0) {
	goto L190;
    }
    iflag = 0;
    if ((iter - 1) % *nprint == 0) {
	fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    if (iflag < 0) {
	goto L300;
    }
L190:

/*           determine the direction p. */

    __minpack_func__(dogleg)(n, &r__[1], lr, &diag[1], &qtf[1], &delta, &wa1[1], &wa2[1], &wa3[
	    1]);

/*           store the direction p and x + p. calculate the norm of p. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	wa1[j] = -wa1[j];
	wa2[j] = x[j] + wa1[j];
	wa3[j] = diag[j] * wa1[j];
/* L200: */
    }
    pnorm = __minpack_func__(enorm)(n, &wa3[1]);

/*           on the first iteration, adjust the initial step bound. */

    if (iter == 1) {
	delta = min(delta,pnorm);
    }

/*           evaluate the function at x + p and calculate its norm. */

    iflag = 1;
    fcnder_nn(n, &wa2[1], &wa4[1], &fjac[fjac_offset], ldfjac, &iflag);
    ++(*nfev);
    if (iflag < 0) {
	goto L300;
    }
    fnorm1 = __minpack_func__(enorm)(n, &wa4[1]);

/*           compute the scaled actual reduction. */

    actred = -1.;
    if (fnorm1 < fnorm) {
/* Computing 2nd power */
	d__1 = fnorm1 / fnorm;
	actred = 1 - d__1 * d__1;
    }

/*           compute the scaled predicted reduction. */

    l = 1;
    i__1 = *n;
    for (i__ = 1; i__ <= i__1; ++i__) {
	sum = 0.;
	i__2 = *n;
	for (j = i__; j <= i__2; ++j) {
	    sum += r__[l] * wa1[j];
	    ++l;
/* L210: */
	}
	wa3[i__] = qtf[i__] + sum;
/* L220: */
    }
    temp = __minpack_func__(enorm)(n, &wa3[1]);
    prered = 0.;
    if (temp < fnorm) {
/* Computing 2nd power */
	d__1 = temp / fnorm;
	prered = 1 - d__1 * d__1;
    }

/*           compute the ratio of the actual to the predicted */
/*           reduction. */

    ratio = 0.;
    if (prered > 0.) {
	ratio = actred / prered;
    }

/*           update the step bound. */

    if (ratio >= p1) {
	goto L230;
    }
    ncsuc = 0;
    ++ncfail;
    delta = p5 * delta;
    goto L240;
L230:
    ncfail = 0;
    ++ncsuc;
    if (ratio >= p5 || ncsuc > 1) {
/* Computing MAX */
	d__1 = delta, d__2 = pnorm / p5;
	delta = max(d__1,d__2);
    }
    if (fabs(ratio - 1) <= p1) {
	delta = pnorm / p5;
    }
L240:

/*           test for successful iteration. */

    if (ratio < p0001) {
	goto L260;
    }

/*           successful iteration. update x, fvec, and their norms. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	x[j] = wa2[j];
	wa2[j] = diag[j] * x[j];
	fvec[j] = wa4[j];
/* L250: */
    }
    xnorm = __minpack_func__(enorm)(n, &wa2[1]);
    fnorm = fnorm1;
    ++iter;
L260:

/*           determine the progress of the iteration. */

    ++nslow1;
    if (actred >= p001) {
	nslow1 = 0;
    }
    if (jeval) {
	++nslow2;
    }
    if (actred >= p1) {
	nslow2 = 0;
    }

/*           test for convergence. */

    if (delta <= *xtol * xnorm || fnorm == 0.) {
	*info = 1;
    }
    if (*info != 0) {
	goto L300;
    }

/*           tests for termination and stringent tolerances. */

    if (*nfev >= *maxfev) {
	*info = 2;
    }
/* Computing MAX */
    d__1 = p1 * delta;
    if (p1 * max(d__1,pnorm) <= epsmch * xnorm) {
	*info = 3;
    }
    if (nslow2 == 5) {
	*info = 4;
    }
    if (nslow1 == 10) {
	*info = 5;
    }
    if (*info != 0) {
	goto L300;
    }

/*           criterion for recalculating jacobian. */

    if (ncfail == 2) {
	goto L290;
    }

/*           calculate the rank one modification to the jacobian */
/*           and update qtf if necessary. */

    i__1 = *n;
    for (j = 1; j <= i__1; ++j) {
	sum = 0.;
	i__2 = *n;
	for (i__ = 1; i__ <= i__2; ++i__) {
	    sum += fjac[i__ + j * fjac_dim1] * wa4[i__];
/* L270: */
	}
	wa2[j] = (sum - wa3[j]) / pnorm;
	wa1[j] = diag[j] * (diag[j] * wa1[j] / pnorm);
	if (ratio >= p0001) {
	    qtf[j] = sum;
	}
/* L280: */
    }

/*           compute the qr factorization of the updated jacobian. */

    __minpack_func__(r1updt)(n, n, &r__[1], lr, &wa1[1], &wa2[1], &wa3[1], &sing);
    __minpack_func__(r1mpyq)(n, n, &fjac[fjac_offset], ldfjac, &wa2[1], &wa3[1]);
    __minpack_func__(r1mpyq)(&c__1, n, &qtf[1], &c__1, &wa2[1], &wa3[1]);

/*           end of the inner loop. */

    jeval = FALSE_;
    goto L180;
L290:

/*        end of the outer loop. */

    goto L30;
L300:

/*     termination, either normal or user imposed. */

    if (iflag < 0) {
	*info = iflag;
    }
    iflag = 0;
    if (*nprint > 0) {
	fcnder_nn(n, &x[1], &fvec[1], &fjac[fjac_offset], ldfjac, &iflag);
    }
    return;

/*     last card of subroutine hybrj. */

}